

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::Array<kj::StringTree::Branch>::dispose(Array<kj::StringTree::Branch> *this)

{
  Branch *pBVar1;
  size_t sVar2;
  
  pBVar1 = this->ptr;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Branch *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }